

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::Session::run(Session *this)

{
  Config *config;
  int iVar1;
  size_t sVar2;
  Option<unsigned_long> listed;
  Runner runner;
  Totals local_280;
  undefined1 local_250 [256];
  ios_base local_150 [264];
  Ptr<Catch::IStreamingReporter> local_48;
  _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
  local_40;
  
  iVar1 = 0;
  if ((this->m_configData).showHelp == false) {
    Session::config(this);
    srand((this->m_configData).rngSeed);
    Runner::Runner((Runner *)local_250,&this->m_config);
    config = Session::config(this);
    local_280.assertions.passed = 0;
    if ((config->m_data).listTests == true) {
      local_280.assertions.failed = listTests(config);
      local_280.assertions.passed = (size_t)&local_280.assertions.failed;
    }
    if ((config->m_data).listTestNamesOnly == true) {
      if ((size_t *)local_280.assertions.passed == (size_t *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = *(size_t *)local_280.assertions.passed;
      }
      local_280.assertions.failed = listTestsNamesOnly(config);
      local_280.assertions.failed = local_280.assertions.failed + sVar2;
      local_280.assertions.passed = (size_t)&local_280.assertions.failed;
    }
    if ((config->m_data).listTags == true) {
      if ((size_t *)local_280.assertions.passed == (size_t *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = *(size_t *)local_280.assertions.passed;
      }
      local_280.assertions.failed = listTags(config);
      local_280.assertions.failed = local_280.assertions.failed + sVar2;
      local_280.assertions.passed = (size_t)&local_280.assertions.failed;
    }
    if ((config->m_data).listReporters == true) {
      if ((size_t *)local_280.assertions.passed == (size_t *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = *(size_t *)local_280.assertions.passed;
      }
      local_280.assertions.failed = listReporters(config);
      local_280.assertions.failed = local_280.assertions.failed + sVar2;
      local_280.assertions.passed = (size_t)&local_280.assertions.failed;
    }
    if ((size_t *)local_280.assertions.passed != (size_t *)0x0) {
      config = (Config *)(ulong)*(uint *)local_280.assertions.passed;
    }
    iVar1 = (int)config;
    if ((size_t *)local_280.assertions.passed == (size_t *)0x0) {
      Runner::runTests(&local_280,(Runner *)local_250);
      iVar1 = (int)local_280.assertions.failed;
    }
    std::
    _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
    ::~_Rb_tree(&local_40);
    if (local_48.m_p != (IStreamingReporter *)0x0) {
      (*((local_48.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
    }
    local_250._8_8_ = _VTT;
    *(undefined8 *)(local_250 + *(long *)(_VTT + -0x18) + 8) = _sqrt;
    std::filebuf::~filebuf((filebuf *)(local_250 + 0x10));
    std::ios_base::~ios_base(local_150);
    if ((Config *)local_250._0_8_ != (Config *)0x0) {
      (*(((SharedImpl<Catch::IConfig> *)local_250._0_8_)->super_IConfig).super_IShared.
        super_NonCopyable._vptr_NonCopyable[3])();
    }
  }
  return iVar1;
}

Assistant:

int run() {
            if( m_configData.showHelp )
                return 0;

            try
            {
                config(); // Force config to be constructed

                std::srand( m_configData.rngSeed );

                Runner runner( m_config );

                // Handle list request
                if( Option<std::size_t> listed = list( config() ) )
                    return static_cast<int>( *listed );

                return static_cast<int>( runner.runTests().assertions.failed );
            }
            catch( std::exception& ex ) {
                Catch::cerr() << ex.what() << std::endl;
                return (std::numeric_limits<int>::max)();
            }
        }